

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_slice.c
# Opt level: O1

size_t slice_fwrite(ALLEGRO_FILE *f,void *ptr,size_t size)

{
  undefined8 *puVar1;
  size_t sVar2;
  ulong uVar3;
  
  puVar1 = (undefined8 *)al_get_file_userdata(f);
  if ((*(uint *)(puVar1 + 4) & 2) != 0) {
    if (((*(uint *)(puVar1 + 4) & 4) == 0) && ((ulong)puVar1[3] < puVar1[2] + size)) {
      size = puVar1[3] - puVar1[2];
    }
    if (size != 0) {
      sVar2 = al_fwrite((ALLEGRO_FILE *)*puVar1,ptr,size);
      uVar3 = sVar2 + puVar1[2];
      puVar1[2] = uVar3;
      if (uVar3 <= (ulong)puVar1[3]) {
        return sVar2;
      }
      puVar1[3] = uVar3;
      return sVar2;
    }
  }
  return 0;
}

Assistant:

static size_t slice_fwrite(ALLEGRO_FILE *f, const void *ptr, size_t size)
{
   SLICE_DATA *slice = al_get_file_userdata(f);
   
   if (!(slice->mode & SLICE_WRITE)) {
      /* no write permissions */
      return 0;
   }
   
   if (!(slice->mode & SLICE_EXPANDABLE) && slice->pos + size > slice->size) {
      /* don't write past the buffer size if not expandable */
      size = slice->size - slice->pos;
   }
   
   if (!size) {
      return 0;
   }
   else {
      /* unbuffered, write directly to parent file */
      size_t b = al_fwrite(slice->fp, ptr, size);
      slice->pos += b;
   
      if (slice->pos > slice->size)
         slice->size = slice->pos;
      
      return b;
   }
}